

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::CommandQueueVkImpl::EnqueueSignalFence(CommandQueueVkImpl *this,VkFence vkFence)

{
  Char *pCVar1;
  undefined1 local_78 [8];
  string msg_1;
  VkResult err;
  lock_guard<std::mutex> QueueGuard;
  undefined1 local_38 [8];
  string msg;
  VkFence vkFence_local;
  CommandQueueVkImpl *this_local;
  
  msg.field_2._8_8_ = vkFence;
  if (vkFence == (VkFence)0x0) {
    FormatString<char[25]>((string *)local_38,(char (*) [25])"vkFence must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"EnqueueSignalFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)local_38);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffb0,&this->m_QueueMutex);
  msg_1.field_2._12_4_ =
       (*vkQueueSubmit)(this->m_VkQueue,0,(VkSubmitInfo *)0x0,(VkFence)msg.field_2._8_8_);
  if (msg_1.field_2._12_4_ != VK_SUCCESS) {
    FormatString<char[59]>
              ((string *)local_78,
               (char (*) [59])"Failed to submit fence signal command to the command queue");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"EnqueueSignalFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xfb);
    std::__cxx11::string::~string((string *)local_78);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void CommandQueueVkImpl::EnqueueSignalFence(VkFence vkFence)
{
    DEV_CHECK_ERR(vkFence != VK_NULL_HANDLE, "vkFence must not be null");

    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    auto err = vkQueueSubmit(m_VkQueue, 0, nullptr, vkFence);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit fence signal command to the command queue");
    (void)err;
}